

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaPostRun(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaIDCAugPtr pxVar1;
  xmlSchemaIDCMatcherPtr pxVar2;
  xmlSchemaIDCMatcherPtr pxVar3;
  void *pvVar4;
  xmlSchemaPSVIIDCNodePtr pxVar5;
  xmlSchemaPSVIIDCKeyPtr pxVar6;
  xmlSchemaValPtr value;
  int iVar7;
  xmlDictPtr pxVar8;
  xmlSchemaIDCAugPtr_conflict pxVar9;
  xmlSchemaPSVIIDCKeyPtr **pppxVar10;
  xmlSchemaPSVIIDCNodePtr *ppxVar11;
  xmlSchemaPSVIIDCKeyPtr *ppxVar12;
  long lVar13;
  xmlSchemaItemListPtr pxVar14;
  xmlSchemaIDCMatcherPtr_conflict pxVar15;
  
  if ((vctxt->xsiAssemble != 0) && (vctxt->schema != (xmlSchemaPtr)0x0)) {
    xmlSchemaFree(vctxt->schema);
    vctxt->schema = (xmlSchemaPtr)0x0;
  }
  vctxt->flags = 0;
  vctxt->validationRoot = (xmlNodePtr)0x0;
  vctxt->doc = (xmlDocPtr)0x0;
  vctxt->reader = (xmlTextReaderPtr)0x0;
  vctxt->hasKeyrefs = 0;
  if (vctxt->value != (xmlSchemaValPtr)0x0) {
    xmlSchemaFreeValue(vctxt->value);
    vctxt->value = (xmlSchemaValPtr)0x0;
  }
  pxVar9 = vctxt->aidcs;
  if (pxVar9 != (xmlSchemaIDCAugPtr_conflict)0x0) {
    do {
      pxVar1 = pxVar9->next;
      (*xmlFree)(pxVar9);
      pxVar9 = pxVar1;
    } while (pxVar1 != (xmlSchemaIDCAugPtr)0x0);
    vctxt->aidcs = (xmlSchemaIDCAugPtr_conflict)0x0;
  }
  pxVar15 = vctxt->idcMatcherCache;
  if (pxVar15 != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
    do {
      pxVar2 = pxVar15->nextCached;
      do {
        pxVar3 = pxVar15->next;
        pppxVar10 = pxVar15->keySeqs;
        if (pppxVar10 != (xmlSchemaPSVIIDCKeyPtr **)0x0) {
          iVar7 = pxVar15->sizeKeySeqs;
          if (0 < iVar7) {
            lVar13 = 0;
            do {
              if (pxVar15->keySeqs[lVar13] != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
                (*xmlFree)(pxVar15->keySeqs[lVar13]);
                iVar7 = pxVar15->sizeKeySeqs;
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < iVar7);
            pppxVar10 = pxVar15->keySeqs;
          }
          (*xmlFree)(pppxVar10);
        }
        pxVar14 = pxVar15->targets;
        if (pxVar14 != (xmlSchemaItemListPtr)0x0) {
          if ((pxVar15->idcType == 0x18) && (0 < pxVar14->nbItems)) {
            lVar13 = 0;
            do {
              pvVar4 = pxVar14->items[lVar13];
              (*xmlFree)(*(void **)((long)pvVar4 + 8));
              (*xmlFree)(pvVar4);
              lVar13 = lVar13 + 1;
              pxVar14 = pxVar15->targets;
            } while (lVar13 < pxVar14->nbItems);
          }
          if (pxVar14->items != (void **)0x0) {
            (*xmlFree)(pxVar14->items);
          }
          (*xmlFree)(pxVar14);
        }
        if (pxVar15->htab != (xmlHashTablePtr)0x0) {
          xmlHashFree(pxVar15->htab,xmlFreeIDCHashEntry);
        }
        (*xmlFree)(pxVar15);
        pxVar15 = pxVar3;
      } while (pxVar3 != (xmlSchemaIDCMatcherPtr)0x0);
      pxVar15 = pxVar2;
    } while (pxVar2 != (xmlSchemaIDCMatcherPtr)0x0);
    vctxt->idcMatcherCache = (xmlSchemaIDCMatcherPtr_conflict)0x0;
  }
  ppxVar11 = vctxt->idcNodes;
  if (ppxVar11 != (xmlSchemaPSVIIDCNodePtr *)0x0) {
    if (0 < vctxt->nbIdcNodes) {
      lVar13 = 0;
      do {
        pxVar5 = vctxt->idcNodes[lVar13];
        (*xmlFree)(pxVar5->keys);
        (*xmlFree)(pxVar5);
        lVar13 = lVar13 + 1;
      } while (lVar13 < vctxt->nbIdcNodes);
      ppxVar11 = vctxt->idcNodes;
    }
    (*xmlFree)(ppxVar11);
    vctxt->idcNodes = (xmlSchemaPSVIIDCNodePtr *)0x0;
    vctxt->nbIdcNodes = 0;
    vctxt->sizeIdcNodes = 0;
  }
  ppxVar12 = vctxt->idcKeys;
  if (ppxVar12 != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
    pppxVar10 = &vctxt->idcKeys;
    if (0 < vctxt->nbIdcKeys) {
      lVar13 = 0;
      do {
        pxVar6 = (*pppxVar10)[lVar13];
        value = pxVar6->val;
        if (value != (xmlSchemaValPtr)0x0) {
          xmlSchemaFreeValue(value);
        }
        (*xmlFree)(pxVar6);
        lVar13 = lVar13 + 1;
      } while (lVar13 < vctxt->nbIdcKeys);
      ppxVar12 = *pppxVar10;
    }
    (*xmlFree)(ppxVar12);
    *pppxVar10 = (xmlSchemaPSVIIDCKeyPtr *)0x0;
    vctxt->nbIdcKeys = 0;
    vctxt->sizeIdcKeys = 0;
  }
  if (vctxt->xpathStates != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
    xmlSchemaFreeIDCStateObjList(vctxt->xpathStates);
    vctxt->xpathStates = (xmlSchemaIDCStateObjPtr_conflict)0x0;
  }
  if (vctxt->nbAttrInfos != 0) {
    xmlSchemaClearAttrInfos(vctxt);
  }
  if ((vctxt->elemInfos != (xmlSchemaNodeInfoPtr *)0x0) && (0 < vctxt->sizeElemInfos)) {
    lVar13 = 0;
    do {
      if (vctxt->elemInfos[lVar13] == (xmlSchemaNodeInfoPtr)0x0) break;
      xmlSchemaClearElemInfo(vctxt,vctxt->elemInfos[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < vctxt->sizeElemInfos);
  }
  pxVar14 = vctxt->nodeQNames;
  if (pxVar14->items != (void **)0x0) {
    (*xmlFree)(pxVar14->items);
    pxVar14->items = (void **)0x0;
  }
  pxVar14->nbItems = 0;
  pxVar14->sizeItems = 0;
  xmlDictFree(vctxt->dict);
  pxVar8 = xmlDictCreate();
  vctxt->dict = pxVar8;
  if (vctxt->filename != (char *)0x0) {
    (*xmlFree)(vctxt->filename);
    vctxt->filename = (char *)0x0;
  }
  return;
}

Assistant:

static void
xmlSchemaPostRun(xmlSchemaValidCtxtPtr vctxt) {
    if (vctxt->xsiAssemble) {
	if (vctxt->schema != NULL) {
	    xmlSchemaFree(vctxt->schema);
	    vctxt->schema = NULL;
	}
    }
    xmlSchemaClearValidCtxt(vctxt);
}